

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTBuilder.cpp
# Opt level: O2

void __thiscall AST::ASTBuilder::adoptChild(ASTBuilder *this)

{
  stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_> *this_00;
  ASTNode *this_01;
  ASTNode *this_02;
  _Elt_pointer ppAVar1;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *_children;
  value_type A;
  ASTNode *local_28;
  
  this_00 = &this->stack;
  ppAVar1 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar1 ==
      (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppAVar1 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  this_01 = ppAVar1[-1];
  std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::pop_back(&this_00->c);
  ppAVar1 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar1 ==
      (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppAVar1 = (this->stack).c.super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  this_02 = ppAVar1[-1];
  local_28 = this_02;
  std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::pop_back(&this_00->c);
  _children = ASTNode::getChildren(this_01);
  ASTNode::adoptChildren(this_02,_children);
  std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::push_back(&this_00->c,&local_28);
  return;
}

Assistant:

void AST::ASTBuilder::adoptChild() {
    auto B = stack.top();
    stack.pop();
    auto A = stack.top();
    stack.pop();
    A->adoptChildren(B->getChildren());
    stack.push(A);
}